

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int av1_convert_q_to_qindex(double q,aom_bit_depth_t bit_depth)

{
  double in_XMM0_Qa;
  double dVar1;
  int qindex;
  aom_bit_depth_t in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined4 local_10;
  
  local_10 = 0;
  while( true ) {
    in_stack_ffffffffffffffec = in_stack_ffffffffffffffec & 0xffffff;
    if (local_10 < 0xff) {
      dVar1 = av1_convert_qindex_to_q(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      in_stack_ffffffffffffffec = CONCAT13(dVar1 < in_XMM0_Qa,(int3)in_stack_ffffffffffffffec);
    }
    if ((char)(in_stack_ffffffffffffffec >> 0x18) == '\0') break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

int av1_convert_q_to_qindex(double q, aom_bit_depth_t bit_depth) {
  int qindex = MINQ;

  // Find the first qindex that matches or exceeds q.
  // Note: this operation can also be done with a binary search, as
  // av1_convert_qindex_to_q() is monotonically increasing with respect to
  // increasing qindex.
  while (qindex < MAXQ && av1_convert_qindex_to_q(qindex, bit_depth) < q) {
    qindex++;
  }

  return qindex;
}